

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo> *this_00;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_01;
  uint *puVar1;
  vec<2U,_float> *pvVar2;
  VectorInfo *pVVar3;
  double *pdVar4;
  raw_node *prVar5;
  double dVar6;
  double dVar7;
  uint new_hash_size;
  value_type vVar8;
  value_type vVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  uint32 uVar12;
  vq_node *pvVar13;
  executable_task *pObj;
  raw_node *prVar14;
  uint uVar15;
  vq_node *pvVar16;
  uint uVar17;
  uint i;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  undefined7 in_register_00000089;
  vec<2U,_float> *pvVar23;
  vec<2U,_float> *pvVar24;
  uint64 data;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_fc;
  undefined1 local_f8 [8];
  float afStack_f0 [4];
  ulong local_e0;
  vector<crnlib::vec<2U,_float>_> *local_d8;
  vector<double> *local_d0;
  undefined1 local_c8 [16];
  bool local_b8;
  node_vec_type *local_a8;
  undefined4 local_9c;
  vec<2U,_float> local_98;
  ulong uStack_90;
  float local_88;
  undefined4 local_84;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined2 uStack_70;
  undefined1 uStack_6e;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  local_68;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo> *local_40;
  elemental_vector *local_38;
  
  local_9c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  this_00 = &this->m_vectorsInfo;
  uVar17 = (this->m_vectorsInfo).m_size;
  if (uVar17 != size) {
    if ((uVar17 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,size,uVar17 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  local_d8 = &this->m_weightedVectors;
  uVar17 = (this->m_weightedVectors).m_size;
  if (uVar17 != size) {
    if ((uVar17 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)local_d8,size,uVar17 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_weightedVectors).m_size = size;
  }
  local_d0 = &this->m_weightedDotProducts;
  uVar17 = (this->m_weightedDotProducts).m_size;
  if (uVar17 != size) {
    if (uVar17 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_d0,size,uVar17 + 1 == size,8,(object_mover)0x0,false);
      }
      uVar17 = (this->m_weightedDotProducts).m_size;
      memset((this->m_weightedDotProducts).m_p + uVar17,0,(ulong)(size - uVar17) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar17 = (this->m_vectorsInfoLeft).m_size;
  if (uVar17 != size) {
    if ((uVar17 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar17 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar17 = (this->m_vectorsInfoRight).m_size;
  if (uVar17 != size) {
    if ((uVar17 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar17 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar17 = (this->m_vectorComparison).m_size;
  if (uVar17 != size) {
    if (uVar17 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar17 + 1 == size,1,
                   (object_mover)0x0,false);
      }
      uVar17 = (this->m_vectorComparison).m_size;
      memset((this->m_vectorComparison).m_p + uVar17,0,(ulong)(size - uVar17));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_a8 = &this->m_nodes;
  uVar20 = max_splits * 4;
  uVar17 = (this->m_nodes).m_size;
  local_40 = this_00;
  if (uVar17 != uVar20) {
    if (uVar17 <= uVar20) {
      if ((this->m_nodes).m_capacity < uVar20) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_a8,uVar20,uVar17 + 1 == uVar20,0x30,
                   vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,
                   false);
      }
      uVar17 = (this->m_nodes).m_size;
      uVar15 = uVar20 - uVar17;
      if (uVar15 != 0) {
        pvVar13 = (this->m_nodes).m_p + uVar17;
        pvVar16 = pvVar13 + uVar15;
        do {
          *(undefined8 *)(pvVar13->m_centroid).m_s = 0;
          pvVar13->m_total_weight = 0;
          pvVar13->m_left = -1;
          pvVar13->m_right = -1;
          pvVar13->m_codebook_index = -1;
          pvVar13->m_unsplittable = false;
          pvVar13->m_alternative = false;
          pvVar13->m_processed = false;
          pvVar13 = pvVar13 + 1;
        } while (pvVar13 != pvVar16);
      }
    }
    (this->m_nodes).m_size = uVar20;
  }
  pvVar2 = (this->m_codebook).m_p;
  local_e0 = (ulong)max_splits;
  if (pvVar2 != (vec<2U,_float> *)0x0) {
    crnlib_free(pvVar2);
    (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  if (pTask_pool == (task_pool *)0x0) {
    uVar25 = 1;
  }
  else {
    uVar25 = (ulong)(pTask_pool->m_num_threads + 1);
  }
  local_98.m_s[0] = 0.0;
  local_98.m_s[1] = 0.0;
  uStack_90 = 0;
  uStack_7c = 0xffffffff;
  uStack_78 = 0xffffffff;
  uStack_74 = 0xffffffff;
  uStack_70 = 0;
  uStack_6e = 0;
  local_84 = 0;
  uVar19 = (ulong)(this->m_vectorsInfo).m_size;
  if (uVar19 == 0) {
    dVar6 = 0.0;
  }
  else {
    pVVar3 = local_40->m_p;
    pvVar2 = local_d8->m_p;
    pdVar4 = local_d0->m_p;
    dVar6 = 0.0;
    uStack_90 = 0;
    uVar22 = 0;
    pvVar23 = pvVar2;
    pvVar24 = vectors;
    do {
      pVVar3[uVar22].index = (uint)uVar22;
      uVar17 = weights[uVar22];
      pVVar3[uVar22].weight = uVar17;
      fVar27 = (float)uVar17;
      lVar18 = 0;
      do {
        *(float *)((long)&local_68.c.
                          super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4) =
             pvVar24->m_s[lVar18] * fVar27;
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      *(pointer *)pvVar2[uVar22].m_s =
           local_68.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        local_98.m_s[lVar18] = pvVar23->m_s[lVar18] + local_98.m_s[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      uStack_90 = uStack_90 + uVar17;
      dVar7 = (double)((vectors[uVar22].m_s[1] * vectors[uVar22].m_s[1] +
                       vectors[uVar22].m_s[0] * vectors[uVar22].m_s[0]) * fVar27);
      pdVar4[uVar22] = dVar7;
      dVar6 = dVar6 + dVar7;
      uVar22 = uVar22 + 1;
      pvVar24 = pvVar24 + 1;
      pvVar23 = pvVar23 + 1;
    } while (uVar22 != uVar19);
  }
  local_88 = (float)(dVar6 - (double)((local_98.m_s[1] * local_98.m_s[1] +
                                      local_98.m_s[0] * local_98.m_s[0]) / (float)uStack_90));
  lVar18 = 0;
  do {
    local_98.m_s[lVar18] = local_98.m_s[lVar18] * (1.0 / (float)uStack_90);
    lVar18 = lVar18 + 1;
  } while (lVar18 == 1);
  local_68.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_fc = 0;
  pvVar13 = local_a8->m_p;
  *&(pvVar13->m_centroid).m_s = local_98.m_s;
  *(undefined4 *)((long)&pvVar13->m_codebook_index + 3) = 0xff;
  pvVar13->m_end = size;
  pvVar13->m_left = 0xffffffff;
  pvVar13->m_right = -1;
  pvVar13->m_codebook_index = -1;
  pvVar13->m_total_weight = uStack_90;
  pvVar13->m_variance = (float)(int)(ulong)(uint)local_88;
  pvVar13->m_begin = (int)((ulong)(uint)local_88 >> 0x20);
  local_c8._0_8_ = (ulong)(uint)local_88 << 0x20;
  local_80 = size;
  local_38 = (elemental_vector *)&this->m_codebook;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&local_68,(value_type *)local_c8);
  local_fc = local_fc + 1;
  uVar20 = 1;
  uVar15 = (uint)uVar25;
  uVar17 = uVar20;
  if (1 < uVar15) {
    if (1 < (uint)local_e0) {
      do {
        uVar17 = uVar20;
        if (((long)local_68.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar25) ||
           (bVar11 = split_node(this,&local_68,&local_fc,pTask_pool), !bVar11)) break;
        uVar20 = uVar20 + 1;
        uVar17 = (uint)local_e0;
      } while ((uint)local_e0 != uVar20);
    }
    if ((long)local_68.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar25) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                *)local_c8,&local_68.c);
      local_d8 = (vector<crnlib::vec<2U,_float>_> *)
                 CONCAT44(local_d8._4_4_,(int)((local_e0 & 0xffffffff) / uVar25));
      local_f8._0_4_ = 0.0;
      local_f8._4_4_ = 0.0;
      afStack_f0[0] = 0.0;
      afStack_f0[1] = 0.0;
      elemental_vector::increase_capacity
                ((elemental_vector *)local_f8,uVar15,false,0xc,(object_mover)0x0,false);
      afStack_f0[0] = (float)uVar15;
      vVar8.m_variance = (float)local_c8._12_4_;
      vVar8.m_index = local_c8._8_4_;
      if ((value_type)local_c8._0_8_ != vVar8) {
        iVar21 = (int)local_e0 * 2;
        local_d0 = (vector<double> *)CONCAT44(local_d0._4_4_,(int)local_d8 * 2);
        data = 0;
        do {
          auVar10 = local_f8;
          *(undefined4 *)((long)local_f8 + data * 0xc) = *(undefined4 *)local_c8._0_8_;
          *(int *)((long)local_f8 + 4 + data * 0xc) = iVar21;
          *(int *)((long)local_f8 + 8 + data * 0xc) = (int)local_d8;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001cea20;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task(pTask_pool,pObj,data,(void *)((long)auVar10 + data * 0xc));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                 *)local_c8);
          iVar21 = iVar21 + (int)local_d0;
          data = (uint64)((int)data + 1);
          vVar9.m_variance = (float)local_c8._12_4_;
          vVar9.m_index = local_c8._8_4_;
        } while ((value_type)local_c8._0_8_ != vVar9);
      }
      task_pool::join(pTask_pool);
      if ((float  [2])local_f8 != (float  [2])0x0) {
        crnlib_free((void *)local_f8);
      }
      if ((value_type)local_c8._0_8_ != (value_type)0x0) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
  }
  if (uVar17 < (uint)local_e0) {
    iVar21 = ~uVar17 + (uint)local_e0;
    do {
      bVar11 = split_node(this,&local_68,&local_fc,pTask_pool);
      bVar26 = iVar21 != 0;
      iVar21 = iVar21 + -1;
    } while (bVar11 && bVar26);
  }
  if (local_fc != 0) {
    this_01 = &this->m_node_index_map;
    uVar25 = 0;
    do {
      pvVar13 = local_a8->m_p;
      if ((pvVar13[uVar25].m_alternative != false) || (pvVar13[uVar25].m_left == -1)) {
        pvVar13 = pvVar13 + uVar25;
        uVar17 = (this->m_codebook).m_size;
        pvVar13->m_codebook_index = uVar17;
        if ((this->m_codebook).m_capacity <= uVar17) {
          elemental_vector::increase_capacity(local_38,uVar17 + 1,true,8,(object_mover)0x0,false);
        }
        *(undefined8 *)(this->m_codebook).m_p[(this->m_codebook).m_size].m_s =
             *(undefined8 *)(pvVar13->m_centroid).m_s;
        puVar1 = &(this->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        if (((char)local_9c != '\0') &&
           (uVar19 = (ulong)pvVar13->m_begin, pvVar13->m_begin < pvVar13->m_end)) {
          do {
            local_f8 = *(undefined1 (*) [8])
                        this->m_vectors[(this->m_vectorsInfo).m_p[uVar19].index].m_s;
            afStack_f0[0] = (float)pvVar13->m_codebook_index;
            local_c8._0_4_ = 0;
            local_c8._4_4_ = 0.0;
            local_c8._8_4_ = 0;
            local_b8 = false;
            if ((this->m_node_index_map).m_values.m_size == 0) {
LAB_0017f7c5:
              new_hash_size = (this->m_node_index_map).m_values.m_size * 2;
              if (new_hash_size < 5) {
                new_hash_size = 4;
              }
              hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
              ::rehash(this_01,new_hash_size);
              bVar11 = hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
                       ::insert_no_grow(this_01,(insert_result *)local_c8,(vec<2U,_float> *)local_f8
                                        ,(uint *)afStack_f0);
              if (!bVar11) {
                crnlib_fail("\"insert() failed\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                            ,0x204);
              }
            }
            else {
              uVar12 = fast_hash((vec<2U,_float> *)local_f8,8);
              uVar17 = uVar12 * -0x61c88647 >> ((byte)(this->m_node_index_map).m_hash_shift & 0x1f);
              prVar5 = (this->m_node_index_map).m_values.m_p;
              prVar14 = prVar5 + uVar17;
              if (prVar5[uVar17].m_bits[0xc] == '\0') {
LAB_0017f786:
                if ((this->m_node_index_map).m_grow_threshold <=
                    (this->m_node_index_map).m_num_valid) goto LAB_0017f7c5;
                *(undefined1 (*) [8])prVar14->m_bits = local_f8;
                *(float *)(prVar14->m_bits + 8) = afStack_f0[0];
                prVar14->m_bits[0xc] = '\x01';
                puVar1 = &(this->m_node_index_map).m_num_valid;
                *puVar1 = *puVar1 + 1;
                local_b8 = true;
                local_c8._0_8_ = this_01;
                local_c8._8_4_ = uVar17;
              }
              else if ((*(float *)prVar14->m_bits != (float)local_f8._0_4_) ||
                      (NAN(*(float *)prVar14->m_bits) || NAN((float)local_f8._0_4_))) {
LAB_0017f6bf:
                uVar20 = (this->m_node_index_map).m_values.m_size - 1;
                uVar22 = (ulong)(uVar17 - 1);
                if (uVar17 == 0) {
                  uVar22 = (ulong)uVar20;
                }
                uVar15 = (uint)uVar22;
                prVar14 = prVar14 + -1;
                if (uVar17 == 0) {
                  prVar14 = prVar5 + uVar20;
                }
                while (uVar17 != uVar15) {
                  uVar15 = (uint)uVar22;
                  bVar11 = prVar14->m_bits[0xc] == '\0';
                  if (bVar11) goto LAB_0017f6e6;
                  if ((*(float *)prVar14->m_bits == (float)local_f8._0_4_) &&
                     (!NAN(*(float *)prVar14->m_bits) && !NAN((float)local_f8._0_4_))) {
                    bVar11 = false;
                    do {
                      bVar26 = bVar11;
                      if (bVar26) goto LAB_0017f76c;
                    } while ((*(float *)(prVar14->m_bits + 4) == (float)local_f8._4_4_) &&
                            (bVar11 = true,
                            !NAN(*(float *)(prVar14->m_bits + 4)) && !NAN((float)local_f8._4_4_)));
                    if (bVar26) {
LAB_0017f76c:
                      local_b8 = false;
                      bVar26 = true;
                      bVar11 = false;
                      uVar17 = uVar15;
                      local_c8._0_8_ = this_01;
                      local_c8._8_4_ = uVar15;
                      goto LAB_0017f77f;
                    }
                  }
                  bVar11 = uVar15 == 0;
                  uVar15 = uVar15 - 1;
                  if (bVar11) {
                    uVar15 = uVar20;
                  }
                  uVar22 = (ulong)uVar15;
                  prVar14 = prVar14 + -1;
                  if (bVar11) {
                    prVar14 = prVar5 + uVar20;
                  }
                }
                bVar11 = false;
LAB_0017f6e6:
                bVar26 = false;
                uVar17 = uVar15;
LAB_0017f77f:
                if (bVar11) goto LAB_0017f786;
                if (!bVar26) goto LAB_0017f7c5;
              }
              else {
                bVar11 = false;
                do {
                  bVar26 = bVar11;
                  if (bVar26) goto LAB_0017f712;
                } while ((*(float *)(prVar14->m_bits + 4) == (float)local_f8._4_4_) &&
                        (bVar11 = true,
                        !NAN(*(float *)(prVar14->m_bits + 4)) && !NAN((float)local_f8._4_4_)));
                if (!bVar26) goto LAB_0017f6bf;
LAB_0017f712:
                local_b8 = false;
                local_c8._0_8_ = this_01;
                local_c8._8_4_ = uVar17;
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < pvVar13->m_end);
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < local_fc);
  }
  if (local_68.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }